

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToUniUTF8::map2
          (CCharmapToUniUTF8 *this,char **outp,size_t *outlen,char *inp,size_t inlen,
          size_t *partial_len)

{
  ulong len;
  size_t __n;
  size_t sVar1;
  
  __n = utf8_ptr::s_trunc(inp,inlen);
  *partial_len = inlen - __n;
  len = *outlen;
  sVar1 = len - __n;
  if (len < __n) {
    __n = utf8_ptr::s_trunc(inp,len);
    sVar1 = 0;
  }
  *outlen = sVar1;
  if (outp != (char **)0x0) {
    memcpy(*outp,inp,__n);
    CCharmapToUni::validate(*outp,__n);
    *outp = *outp + __n;
  }
  return inlen;
}

Assistant:

size_t CCharmapToUniUTF8::map2(char **outp, size_t *outlen,
                               const char *inp, size_t inlen,
                               size_t *partial_len) const
{
    size_t copy_len;

    /* 
     *   Make sure we copy only whole characters, by truncating the string
     *   to a length that includes only whole characters.  
     */
    copy_len = utf8_ptr::s_trunc(inp, inlen);

    /* 
     *   note the length of any partial characters at the end of the buffer
     *   for the caller - this is simply the difference between the original
     *   length and the truncated copy length, since the truncation length
     *   is simply the length excluding the partial last character bytes 
     */
    *partial_len = inlen - copy_len;

    /* limit the copying to what will fit in the output buffer */
    if (copy_len > *outlen)
    {
        /* don't copy more than will fit, and don't copy partial characters */
        copy_len = utf8_ptr::s_trunc(inp, *outlen);

        /* we don't have enough room, so set the output size to zero */
        *outlen = 0;
    }
    else
    {
        /* we have room, so decrement the output size by the copy size */
        *outlen -= copy_len;
    }

    /* copy the data, if we have an output buffer */
    if (outp != 0)
    {
        /* copy the bytes */
        memcpy(*outp, inp, copy_len);

        /* validate that the bytes we copied are well-formed UTF-8 */
        validate(*outp, copy_len);
        
        /* advance the output pointer past the copied data */
        *outp += copy_len;
    }

    /* 
     *   return the total input length -- the total output length is
     *   always identical to the input length, because we don't change
     *   anything 
     */
    return inlen;
}